

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void * ym2610_init(void *param,UINT32 clock,UINT32 rate,FM_TIMERHANDLER timer_handler,
                  FM_IRQHANDLER IRQHandler)

{
  undefined1 auVar1 [16];
  uint uVar2;
  void *pvVar3;
  long lVar4;
  YM2610 *F2610;
  uint uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  pvVar3 = calloc(1,0x5410);
  if (pvVar3 != (void *)0x0) {
    init_tables();
    *(void **)((long)pvVar3 + 0x210) = param;
    *(undefined1 *)((long)pvVar3 + 0x208) = 0x37;
    *(long *)((long)pvVar3 + 0x6a0) = (long)pvVar3 + 0x4778;
    *(UINT32 *)((long)pvVar3 + 0x218) = clock;
    *(UINT32 *)((long)pvVar3 + 0x21c) = rate;
    uVar5 = rate - clock / 0x90;
    uVar2 = -uVar5;
    if (0 < (int)uVar5) {
      uVar2 = uVar5;
    }
    *(bool *)((long)pvVar3 + 0x209) = uVar2 < 3;
    *(FM_TIMERHANDLER *)((long)pvVar3 + 0x648) = timer_handler;
    *(FM_IRQHANDLER *)((long)pvVar3 + 0x650) = IRQHandler;
    *(code **)((long)pvVar3 + 0x658) = ssgdummy_set_clock;
    *(code **)((long)pvVar3 + 0x660) = ssgdummy_write;
    *(code **)((long)pvVar3 + 0x668) = ssgdummy_read;
    *(code **)((long)pvVar3 + 0x670) = ssgdummy_reset;
    *(long *)((long)pvVar3 + 0x5368) = (long)pvVar3 + 0x4760;
    *(code **)((long)pvVar3 + 0x53d8) = YM2610_deltat_status_set;
    *(code **)((long)pvVar3 + 0x53e0) = YM2610_deltat_status_reset;
    *(void **)((long)pvVar3 + 0x53e8) = pvVar3;
    *(undefined1 *)((long)pvVar3 + 0x53f0) = 0x80;
    YM_DELTAT_ADPCM_Init
              ((YM_DELTAT *)((long)pvVar3 + 0x5368),1,8,(INT32 *)((long)pvVar3 + 0x473c),0x800000);
    Init_ADPCMATable();
    auVar1 = _DAT_00172610;
    lVar4 = 0;
    auVar8 = _DAT_00172600;
    do {
      auVar7 = auVar8 ^ auVar1;
      if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7ffffffa) {
        *(undefined1 *)((long)pvVar3 + lVar4 + 0x4908) = 0;
        *(undefined1 *)((long)pvVar3 + lVar4 + 0x4aa0) = 0;
      }
      lVar6 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar6 + 2;
      lVar4 = lVar4 + 0x330;
    } while (lVar4 != 0x990);
    lVar4 = 0;
    auVar7 = _DAT_00172600;
    do {
      auVar8 = auVar7 ^ auVar1;
      if (auVar8._4_4_ == -0x80000000 && auVar8._0_4_ < -0x7ffffffa) {
        *(undefined1 *)((long)pvVar3 + lVar4 + 0x5158) = 0;
        *(undefined1 *)((long)pvVar3 + lVar4 + 0x5198) = 0;
      }
      lVar6 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar6 + 2;
      lVar4 = lVar4 + 0x80;
    } while (lVar4 != 0x180);
    *(undefined1 *)((long)pvVar3 + 0x5408) = 0;
  }
  return pvVar3;
}

Assistant:

void *ym2610_init(void *param, UINT32 clock, UINT32 rate,
				FM_TIMERHANDLER timer_handler,FM_IRQHANDLER IRQHandler)
{
	YM2610 *F2610;

	/* allocate extend state space */
	F2610 = (YM2610 *)calloc(1,sizeof(YM2610));
	if( F2610==NULL)
		return NULL;

	/* allocate total level table (128kb space) */
	init_tables();

	/* FM */
	F2610->OPN.ST.param = param;
	F2610->OPN.type = TYPE_YM2610;
	F2610->OPN.P_CH = F2610->CH;
	F2610->OPN.ST.clock = clock;
	F2610->OPN.ST.rate = rate;
	OPNCheckNativeSampleRate(&F2610->OPN);
	/* Extend handler */
	F2610->OPN.ST.timer_handler = timer_handler;
	F2610->OPN.ST.IRQ_Handler   = IRQHandler;
	OPNLinkSSG(&F2610->OPN, NULL, NULL);
	OPNSetSmplRateChgCallback(&F2610->OPN, NULL, NULL);
	/* ADPCM */
	F2610->pcmbuf   = NULL;
	F2610->pcm_size = 0x00;
	/* DELTA-T */
	F2610->deltaT.logger = &F2610->OPN.logger;
	F2610->deltaT.memory = NULL;
	F2610->deltaT.memory_size = 0x00;
	F2610->deltaT.memory_mask = 0x00;

	F2610->deltaT.status_set_handler = YM2610_deltat_status_set;
	F2610->deltaT.status_reset_handler = YM2610_deltat_status_reset;
	F2610->deltaT.status_change_which_chip = F2610;
	F2610->deltaT.status_change_EOS_bit = 0x80; /* status flag: set bit7 on End Of Sample */

	YM_DELTAT_ADPCM_Init(&F2610->deltaT,YM_DELTAT_EMULATION_MODE_YM2610,8,F2610->OPN.out_delta,1<<23);

	Init_ADPCMATable();

	ym2610_set_mute_mask(F2610, 0x00);

	return F2610;
}